

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O0

bool __thiscall bitio::bitio_stream::is_eof(bitio_stream *this)

{
  void *__ptr;
  size_t sVar1;
  char *tmp_ptr;
  bitio_stream *this_local;
  
  if ((this->eof & 1U) == 0) {
    if (this->byte_index == this->current_buffer_length) {
      __ptr = operator_new__(1);
      sVar1 = fread(__ptr,1,1,(FILE *)this->file);
      this->eof = sVar1 == 0;
      free(__ptr);
      if ((this->eof & 1U) == 0) {
        fseek((FILE *)this->file,-1,1);
      }
    }
    this_local._7_1_ = (bool)(this->eof & 1);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool bitio_stream::is_eof() {
    if (eof) return true;
    if (byte_index == current_buffer_length) {
        auto *tmp_ptr = new char[1];
        eof = fread(tmp_ptr, 1, 1, file) == 0;
        free(tmp_ptr);

        if (!eof) fseek(file, -1, SEEK_CUR);
    }
    return eof;
}